

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

string * __thiscall Cpu::lookup_abi_cxx11_(string *__return_storage_ptr__,Cpu *this)

{
  ushort uVar1;
  ushort uVar2;
  ostream *poVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  string op;
  ostringstream outs;
  allocator aaStack_1d8 [32];
  char *local_1b8;
  size_type local_1b0;
  char local_1a8;
  undefined7 uStack_1a7;
  undefined8 uStack_1a0;
  allocator local_198 [376];
  
  std::__cxx11::string::string((string *)&local_1b8,"",local_198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  uVar1 = this->ROM[this->pc];
  if (uVar1 == 0xfff) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"END",aaStack_1d8);
    goto LAB_00103d38;
  }
  uVar2 = uVar1 >> 8;
  bVar4 = (byte)uVar1;
  if (uVar2 == 0xc) {
    poVar3 = std::operator<<((ostream *)local_198,"mov w, #");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::operator<<(poVar3,(uint)bVar4);
    std::__cxx11::stringbuf::str();
    goto LAB_00103cde;
  }
  uVar5 = (uint)uVar1;
  if (uVar2 == 0xb) {
    poVar3 = std::operator<<((ostream *)local_198,"jmp ");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::operator<<(poVar3,uVar5 & 0x1ff);
    std::__cxx11::stringbuf::str();
LAB_0010389f:
    std::__cxx11::string::operator=((string *)&local_1b8,(string *)aaStack_1d8);
    std::__cxx11::string::~string((string *)aaStack_1d8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    if (uVar2 == 10) {
      poVar3 = std::operator<<((ostream *)local_198,"jmp ");
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::operator<<(poVar3,(uint)bVar4);
      std::__cxx11::stringbuf::str();
      goto LAB_0010389f;
    }
    uVar7 = (uint)(uVar1 >> 5);
    uVar6 = (uint)uVar1;
    if (uVar7 == 1) {
      poVar3 = std::operator<<((ostream *)local_198,"mov ");
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar6 & 0x1f);
      std::operator<<(poVar3,", w");
      std::__cxx11::stringbuf::str();
LAB_00103cde:
      std::__cxx11::string::operator=((string *)&local_1b8,(string *)aaStack_1d8);
      std::__cxx11::string::~string((string *)aaStack_1d8);
    }
    else {
      if (uVar2 == 5) {
        poVar3 = std::operator<<((ostream *)local_198,"setb ");
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar6 & 0x1f);
        poVar3 = std::operator<<(poVar3,".");
        std::ostream::operator<<(poVar3,uVar7 & 7);
        std::__cxx11::stringbuf::str();
        goto LAB_00103cde;
      }
      if (uVar7 == 0xe) {
        poVar3 = std::operator<<((ostream *)local_198,"add w, ");
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<(poVar3,uVar5 & 0x1f);
        std::__cxx11::stringbuf::str();
        goto LAB_00103cde;
      }
      if (uVar7 == 0xf) {
        poVar3 = std::operator<<((ostream *)local_198,"add ");
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar6 & 0x1f);
        std::operator<<(poVar3,", w");
        std::__cxx11::stringbuf::str();
        goto LAB_00103cde;
      }
      if (uVar2 == 6) {
        poVar3 = std::operator<<((ostream *)local_198,"snb ");
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar6 & 0x1f);
        poVar3 = std::operator<<(poVar3,".");
        std::ostream::operator<<(poVar3,uVar7 & 7);
        std::__cxx11::stringbuf::str();
        goto LAB_00103cde;
      }
      if (uVar7 == 10) {
        poVar3 = std::operator<<((ostream *)local_198,"and w, ");
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<(poVar3,uVar5 & 0x1f);
        std::__cxx11::stringbuf::str();
        goto LAB_00103cde;
      }
      if (uVar7 == 0xb) {
        poVar3 = std::operator<<((ostream *)local_198,"and ");
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar6 & 0x1f);
        std::operator<<(poVar3,", w");
        std::__cxx11::stringbuf::str();
        goto LAB_00103cde;
      }
      if (uVar2 == 0xe) {
        poVar3 = std::operator<<((ostream *)local_198,"and w, #");
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<(poVar3,(uint)bVar4);
        std::__cxx11::stringbuf::str();
        goto LAB_00103cde;
      }
      if (uVar7 == 9) {
        poVar3 = std::operator<<((ostream *)local_198,"or ");
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar5 & 0x1f);
        std::operator<<(poVar3,", w");
        std::__cxx11::stringbuf::str();
        goto LAB_00103cde;
      }
      if (uVar7 == 0x13) {
        poVar3 = std::operator<<((ostream *)local_198,"not ");
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<(poVar3,uVar6 & 0x1f);
        std::__cxx11::stringbuf::str();
        goto LAB_00103cde;
      }
      if (uVar2 == 0xd) {
        poVar3 = std::operator<<((ostream *)local_198,"or w, #");
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<(poVar3,(uint)bVar4);
        std::__cxx11::stringbuf::str();
        goto LAB_00103cde;
      }
      if (uVar7 == 0xd) {
        poVar3 = std::operator<<((ostream *)local_198,"xor ");
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar5 & 0x1f);
        std::operator<<(poVar3,", w");
        std::__cxx11::stringbuf::str();
        goto LAB_00103cde;
      }
      if (uVar7 == 0xc) {
        poVar3 = std::operator<<((ostream *)local_198,"xor w, ");
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<(poVar3,uVar5 & 0x1f);
        std::__cxx11::stringbuf::str();
        goto LAB_00103cde;
      }
      if (uVar7 == 8) {
        poVar3 = std::operator<<((ostream *)local_198,"or w, ");
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<(poVar3,uVar6 & 0x1f);
        std::__cxx11::stringbuf::str();
        goto LAB_00103cde;
      }
      if (uVar2 == 0xf) {
        poVar3 = std::operator<<((ostream *)local_198,"xor w, #");
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<(poVar3,(uint)bVar4);
        std::__cxx11::stringbuf::str();
        goto LAB_00103cde;
      }
      if (uVar7 == 3) {
        poVar3 = std::operator<<((ostream *)local_198,"clr ");
        *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
             *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<(poVar3,uVar6 & 0x1f);
        std::__cxx11::stringbuf::str();
        goto LAB_00103cde;
      }
      if ((uVar5 != 0x40) && (uVar6 != 4)) {
        if (uVar7 == 7) {
          poVar3 = std::operator<<((ostream *)local_198,"dec ");
          *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
               *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
          std::ostream::operator<<(poVar3,uVar6 & 0x1f);
          std::__cxx11::stringbuf::str();
        }
        else if (uVar2 == 7) {
          poVar3 = std::operator<<((ostream *)local_198,"sb ");
          *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
               *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar6 & 0x1f);
          poVar3 = std::operator<<(poVar3,".");
          std::ostream::operator<<(poVar3,uVar7 & 7);
          std::__cxx11::stringbuf::str();
        }
        else {
          switch(uVar7 - 5 >> 1 | (uint)((uVar7 - 5 & 1) != 0) << 0x1f) {
          case 0:
            poVar3 = std::operator<<((ostream *)local_198,"sub ");
            *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                 *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar6 & 0x1f);
            std::operator<<(poVar3," w");
            std::__cxx11::stringbuf::str();
            break;
          default:
            if (uVar2 == 4) {
              poVar3 = std::operator<<((ostream *)local_198,"clrb ");
              *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                   *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar6 & 0x1f);
              poVar3 = std::operator<<(poVar3,".");
              std::ostream::operator<<(poVar3,uVar7 & 7);
              std::__cxx11::stringbuf::str();
            }
            else {
              uVar5 = (uint)uVar1;
              switch(uVar7 - 4 >> 1 | (uint)((uVar7 - 4 & 1) != 0) << 0x1f) {
              case 0:
                poVar3 = std::operator<<((ostream *)local_198,"mov w, ");
                *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                     *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
                poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar5 & 0x1f);
                std::operator<<(poVar3,"-w");
                std::__cxx11::stringbuf::str();
                break;
              case 1:
                poVar3 = std::operator<<((ostream *)local_198,"mov w, --");
                *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                     *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
                std::ostream::operator<<(poVar3,uVar5 & 0x1f);
                std::__cxx11::stringbuf::str();
                break;
              default:
                if (uVar6 == 0x43) {
                  std::operator<<((ostream *)local_198,"mov m, w");
                  std::__cxx11::stringbuf::str();
                }
                else if ((uVar6 & 0xfffffff0) == 0x50) {
                  poVar3 = std::operator<<((ostream *)local_198,"mov m, #");
                  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 |
                       8;
                  std::ostream::operator<<(poVar3,uVar6 & 0xf);
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar6 == 2) {
                  std::operator<<((ostream *)local_198,"mov !option, w");
                  std::__cxx11::stringbuf::str();
                }
                else if ((ushort)(uVar1 - 5) < 5) {
                  std::operator<<((ostream *)local_198,"mov !rx, w");
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar7 == 0x11) {
                  poVar3 = std::operator<<((ostream *)local_198,"test ");
                  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 |
                       8;
                  std::ostream::operator<<(poVar3,uVar6 & 0x1f);
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar6 == 0) {
                  std::operator<<((ostream *)local_198,"nop");
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar2 == 9) {
                  poVar3 = std::operator<<((ostream *)local_198,"call ");
                  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 |
                       8;
                  std::ostream::operator<<(poVar3,(uint)bVar4 | (*this->status & 0xffffffe0) << 4);
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar6 == 0xd) {
                  std::operator<<((ostream *)local_198,"retp");
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar6 == 0xc) {
                  std::operator<<((ostream *)local_198,"ret");
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar2 == 8) {
                  poVar3 = std::operator<<((ostream *)local_198,"retw ");
                  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 |
                       8;
                  std::ostream::operator<<(poVar3,(uint)bVar4);
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar1 >> 3 == 2) {
                  poVar3 = std::operator<<((ostream *)local_198,"page ");
                  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 |
                       8;
                  std::ostream::operator<<(poVar3,uVar5 & 7);
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar1 >> 3 == 3) {
                  poVar3 = std::operator<<((ostream *)local_198,"bank ");
                  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 |
                       8;
                  std::ostream::operator<<(poVar3,uVar5 & 7);
                  std::__cxx11::stringbuf::str();
                }
                else if (uVar5 == 0x41) {
                  std::operator<<((ostream *)local_198,"IREAD");
                  std::__cxx11::stringbuf::str();
                }
                else {
                  poVar3 = std::operator<<((ostream *)local_198,"not impl ");
                  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 |
                       8;
                  std::ostream::operator<<(poVar3,uVar1);
                  std::__cxx11::stringbuf::str();
                }
                break;
              case 6:
                poVar3 = std::operator<<((ostream *)local_198,"mov w, ");
                *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                     *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
                std::ostream::operator<<(poVar3,uVar5 & 0x1f);
                std::__cxx11::stringbuf::str();
                break;
              case 7:
                poVar3 = std::operator<<((ostream *)local_198,"mov w, /");
                *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                     *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
                std::ostream::operator<<(poVar3,uVar5 & 0x1f);
                std::__cxx11::stringbuf::str();
                break;
              case 8:
                poVar3 = std::operator<<((ostream *)local_198,"mov w, ++");
                *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                     *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
                std::ostream::operator<<(poVar3,uVar6 & 0x1f);
                std::__cxx11::stringbuf::str();
                break;
              case 9:
                poVar3 = std::operator<<((ostream *)local_198,"movsz w, --");
                *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                     *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
                std::ostream::operator<<(poVar3,uVar6 & 0x1f);
                std::__cxx11::stringbuf::str();
                break;
              case 10:
                poVar3 = std::operator<<((ostream *)local_198,"mov w, <<");
                *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                     *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
                std::ostream::operator<<(poVar3,uVar6 & 0x1f);
                std::__cxx11::stringbuf::str();
                break;
              case 0xb:
                poVar3 = std::operator<<((ostream *)local_198,"mov w, <<");
                *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                     *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
                std::ostream::operator<<(poVar3,uVar6 & 0x1f);
                std::__cxx11::stringbuf::str();
                break;
              case 0xc:
                poVar3 = std::operator<<((ostream *)local_198,"mov w, <>");
                *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                     *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
                std::ostream::operator<<(poVar3,uVar6 & 0x1f);
                std::__cxx11::stringbuf::str();
                break;
              case 0xd:
                poVar3 = std::operator<<((ostream *)local_198,"movsz w, ++");
                *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                     *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
                std::ostream::operator<<(poVar3,uVar6 & 0x1f);
                std::__cxx11::stringbuf::str();
              }
            }
            break;
          case 8:
            poVar3 = std::operator<<((ostream *)local_198,"inc ");
            *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                 *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
            std::ostream::operator<<(poVar3,uVar6 & 0x1f);
            std::__cxx11::stringbuf::str();
            break;
          case 9:
            poVar3 = std::operator<<((ostream *)local_198,"decsz ");
            *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                 *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
            std::ostream::operator<<(poVar3,uVar6 & 0x1f);
            std::__cxx11::stringbuf::str();
            break;
          case 10:
            poVar3 = std::operator<<((ostream *)local_198,"RR ");
            *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                 *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
            std::ostream::operator<<(poVar3,uVar6 & 0x1f);
            std::__cxx11::stringbuf::str();
            break;
          case 0xb:
            poVar3 = std::operator<<((ostream *)local_198,"RL ");
            *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                 *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
            std::ostream::operator<<(poVar3,uVar6 & 0x1f);
            std::__cxx11::stringbuf::str();
            break;
          case 0xc:
            poVar3 = std::operator<<((ostream *)local_198,"swap ");
            *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                 *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
            std::ostream::operator<<(poVar3,uVar6 & 0x1f);
            std::__cxx11::stringbuf::str();
            break;
          case 0xd:
            poVar3 = std::operator<<((ostream *)local_198,"incsz ");
            *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
                 *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
            std::ostream::operator<<(poVar3,uVar6 & 0x1f);
            std::__cxx11::stringbuf::str();
          }
        }
        goto LAB_00103cde;
      }
      std::__cxx11::string::assign((char *)&local_1b8);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  if (local_1b8 == &local_1a8) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1a7,local_1a8);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_1a0;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1b8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1a7,local_1a8);
  }
  __return_storage_ptr__->_M_string_length = local_1b0;
  local_1b0 = 0;
  local_1a8 = '\0';
  local_1b8 = &local_1a8;
LAB_00103d38:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  return __return_storage_ptr__;
}

Assistant:

string Cpu::lookup()
{
	string
	op = "";
	ostringstream outs;
	USHORT
	mne = ROM[pc];
	if (mne == 0xfff)
	{
		return "END";
	}
	if (mne >> 8 == 0xa)
	{				//jmp
		outs << "jmp " << hex << (mne & 0x1ff);
		op = outs.str();
		return op;
	}
	else if (mne >> 8 == 0xb)
	{				//jmp
		outs << "jmp " << hex << (mne & 0x1ff);
		op = outs.str();
		return op;
	}
	else if (mne >> 8 == 0xc)
	{				//mov w,lit
		outs << "mov w, #" << hex << (mne & 0xff);
		op = outs.str();
	}
	else if (mne >> 5 == 1)
	{				//mov fr,w
		outs << "mov " << hex << (mne & 0x1f) << ", w";
		op = outs.str();
	}
	else if (mne >> 8 == 5)
	{				//setb fr.bit
		int
		bit = (mne >> 5) & 7;
		outs << "setb " << hex << (mne & 0x1f) << "." << bit;
		op = outs.str();

	}
	else if (mne >> 5 == 0xf)
	{				//add fr,w
		outs << "add " << hex << (mne & 0x1f) << ", w";
		op = outs.str();
	}
	else if (mne >> 5 == 0xe)
	{				//add w,fr
		outs << "add w, " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 8 == 6)
	{				//snb fr.bit
		int
		bit = (mne >> 5) & 7;
		outs << "snb " << hex << (mne & 0x1f) << "." << bit;
		op = outs.str();
	}
	else if (mne >> 5 == 11)
	{				//and fr,w
		outs << "and " << hex << (mne & 0x1f) << ", w";
		op = outs.str();
	}
	else if (mne >> 5 == 10)
	{				//and w,fr
		outs << "and w, " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 8 == 0xe)
	{				//and w,#lit
		outs << "and w, #" << hex << (mne & 0xff);
		op = outs.str();
	}
	else if (mne >> 5 == 0x13)
	{				//not fr
		outs << "not " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 9)
	{				//or fr,w
		outs << "or " << hex << (mne & 0x1f) << ", w";
		op = outs.str();
	}
	else if (mne >> 8 == 0xd)
	{				//or w,#lit
		outs << "or w, #" << hex << (mne & 0xff);
		op = outs.str();
	}
	else if (mne >> 5 == 8)
	{				//or w,fr
		outs << "or w, " << hex << (mne & 0x1f);
		op = outs.str();

	}
	else if (mne >> 5 == 13)
	{				//xor fr,w
		outs << "xor " << hex << (mne & 0x1f) << ", w";
		op = outs.str();
	}
	else if (mne >> 5 == 12)
	{				//xor w,fr
		outs << "xor w, " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 8 == 0xf)
	{				//xor w,#lit
		outs << "xor w, #" << hex << (mne & 0xff);
		op = outs.str();
	}
	else if (mne >> 5 == 3)
	{				//clr fr
		outs << "clr " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne == 0x40)
	{				//clr w
		op = "clr w";
	}
	else if (mne == 4)
	{				//clr !WDT
		op = "clr !WDT";
	}
	else if (mne >> 5 == 7)
	{				//dec fr
		outs << "dec " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 8 == 7)
	{				//sb fr.bit
		int
		bit = (mne >> 5) & 7;
		outs << "sb " << hex << (mne & 0x1f) << "." << bit;
		op = outs.str();
	}
	else if (mne >> 5 == 0x17)
	{				//decsz fr
		outs << "decsz " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x15)
	{				//inc fr
		outs << "inc " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x1f)
	{				//incsz fr
		outs << "incsz " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x1b)
	{				//RL fr
		outs << "RL " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x19)
	{				//RR fr
		outs << "RR " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 5)
	{				//sub fr,w
		outs << "sub " << hex << (mne & 0x1f) << " w";
		op = outs.str();
	}
	else if (mne >> 5 == 0x1d)
	{				//swap fr
		outs << "swap " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 8 == 4)
	{				//clrb fr.bit
		int
		bit = (mne >> 5) & 7;
		outs << "clrb " << hex << (mne & 0x1f) << "." << bit;
		op = outs.str();
	}
	else if (mne >> 5 == 0x10)
	{				//mov w,fr
		outs << "mov w, " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x4)
	{				//mov w,fr-w
		outs << "mov w, " << hex << (mne & 0x1f) << "-w";
		op = outs.str();
	}
	else if (mne >> 5 == 0x12)
	{				//mov w,/fr (complement)
		outs << "mov w, /" << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x6)
	{				//mov w,--fr
		outs << "mov w, --" << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x14)
	{				//mov w,++fr
		outs << "mov w, ++" << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x1a)
	{				//mov w,<<fr
		outs << "mov w, <<" << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x18)
	{				//mov w,>>fr
		outs << "mov w, <<" << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x1c)
	{				//mov w,<>fr
		outs << "mov w, <>" << hex << (mne & 0x1f);
		op = outs.str();
	}
	//TODO: mov w,m
	else if (mne >> 5 == 0x16)
	{				//movsz w,--fr
		outs << "movsz w, --" << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne >> 5 == 0x1e)
	{				//movsz w,++fr
		outs << "movsz w, ++" << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne == 0x43)
	{ //mov m,w
		outs << "mov m, w";
		op = outs.str();
	}
	else if (mne >> 4 == 0x5)
	{ //mov m,#lit
		outs << "mov m, #" << hex << (mne&0xf);
		op = outs.str();
	}
	else if (mne == 0x2)
	{ //mov !option,w
		outs << "mov !option, w";
		op = outs.str();
	}
	else if (mne > 4 && mne < 10)
	{
		outs << "mov !rx, w";
		op = outs.str();
	}
	//mov !option,w
	else if (mne >> 5 == 0x11)
	{				//test fr
		outs << "test " << hex << (mne & 0x1f);
		op = outs.str();
	}
	else if (mne == 0)
	{				//nop
		outs << "nop";
		op = outs.str();
	}
	else if (mne >> 8 == 9)
	{ //call addr8
		outs << "call " << hex << ((*status & 0xe0) << 4 | mne & 0xff);
		op = outs.str();
	}
	else if (mne == 0xc)
	{ //ret
		outs << "ret";
		op = outs.str();
	}
	else if (mne == 0xd)
	{ //retp
		outs << "retp";
		op = outs.str();
	}
	else if (mne >> 8 == 0x8)
	{ //retw #lit
		outs << "retw " << hex << (mne&0xff);
		op = outs.str();
	}
	else if (mne >> 3 == 3)
	{ //bank addr12
		outs << "bank " << hex << (mne&7);
		op = outs.str();
	}
	else if (mne >> 3 == 2)
	{ //page addr12
		outs << "page " << hex << (mne&7);
		op = outs.str();
	}
	else if (mne == 0x41)
	{ //IREAD
		outs << "IREAD";
		op = outs.str();
	}
	else
	{
		outs << "not impl " << hex << mne;
		op = outs.str();
	}
	return op;
}